

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2long.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  while( true ) {
    pcVar2 = fgets(main::buf,0x18c7,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    sVar3 = strlen(main::buf);
    if (0x18c5 < sVar3) break;
    iVar1 = __isoc99_sscanf(main::buf,"%21s %21s %6299s",main::timestamp,main::device,main::afrbuf);
    if (iVar1 != 3) {
      return 1;
    }
    iVar1 = parse_canframe(main::afrbuf,&main::cu);
    if (iVar1 == 0x10) {
      main::cu.cc.__pad = 0;
    }
    else {
      if (iVar1 != 0x48) {
        pcVar2 = "read: no valid CAN CC/FD frame\n";
        goto LAB_001012a6;
      }
      main::cu.cc.__pad = main::cu.cc.__pad | 4;
    }
    snprintf_long_canframe(main::afrbuf,0x189c,&main::cu,0x11);
    printf("%s  %s  %s\n",main::timestamp,main::device,main::afrbuf);
  }
  pcVar2 = "line too long for input buffer\n";
LAB_001012a6:
  fwrite(pcVar2,0x1f,1,_stderr);
  return 1;
}

Assistant:

int main(void)
{
	static char buf[BUFSZ], timestamp[TIMESZ], device[DEVSZ], afrbuf[AFRSZ];
	static cu_t cu;
	int mtu;

	while (fgets(buf, BUFSZ-1, stdin)) {

		if (strlen(buf) >= BUFSZ-2) {
			fprintf(stderr, "line too long for input buffer\n");
			return 1;
		}

		if (sscanf(buf, "%21s %21s %6299s", timestamp, device, afrbuf) != 3)
			return 1;

		mtu = parse_canframe(afrbuf, &cu);

		/* mark dual-use struct canfd_frame - no CAN_XL support */
		if (mtu == CAN_MTU)
			cu.fd.flags = 0;
		else if (mtu == CANFD_MTU)
			cu.fd.flags |= CANFD_FDF;
		else {
			fprintf(stderr, "read: no valid CAN CC/FD frame\n");
			return 1;
		}

		/* with ASCII output */
		snprintf_long_canframe(afrbuf, sizeof(afrbuf), &cu,
				       (CANLIB_VIEW_INDENT_SFF | CANLIB_VIEW_ASCII));

		printf("%s  %s  %s\n", timestamp, device, afrbuf);
	}

	return 0;
}